

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O3

const_iterator __thiscall ArgumentParser::ActionMap::Find(ActionMap *this,string_view name)

{
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>
  *ppVar1;
  int iVar2;
  ulong __n;
  ulong __n_00;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>
  *ppVar3;
  difference_type __d;
  ulong uVar4;
  long lVar6;
  ulong uVar5;
  
  __n_00 = name._M_len;
  ppVar3 = (this->
           super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
           ).
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->
           super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
           ).
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (long)ppVar1 - (long)ppVar3) {
    uVar5 = ((ulong)((long)ppVar1 - (long)ppVar3) >> 4) * -0x5555555555555555;
    do {
      uVar4 = uVar5 >> 1;
      __n = ppVar3[uVar4].first._M_len;
      lVar6 = __n - __n_00;
      if (__n_00 <= __n) {
        __n = __n_00;
      }
      if ((__n == 0) || (iVar2 = memcmp(ppVar3[uVar4].first._M_str,name._M_str,__n), iVar2 == 0)) {
        if (lVar6 < -0x7fffffff) {
          lVar6 = -0x80000000;
        }
        if (0x7ffffffe < lVar6) {
          lVar6 = 0x7fffffff;
        }
        iVar2 = (int)lVar6;
      }
      if (iVar2 < 0) {
        ppVar3 = ppVar3 + uVar4 + 1;
        uVar4 = ~uVar4 + uVar5;
      }
      uVar5 = uVar4;
    } while (0 < (long)uVar4);
  }
  if ((ppVar3 != ppVar1) && ((ppVar3->first)._M_len == __n_00)) {
    if (__n_00 == 0) {
      return (const_iterator)ppVar3;
    }
    iVar2 = bcmp((ppVar3->first)._M_str,name._M_str,__n_00);
    if (iVar2 == 0) {
      return (const_iterator)ppVar3;
    }
  }
  return (const_iterator)ppVar1;
}

Assistant:

auto ActionMap::Find(cm::string_view name) const -> const_iterator
{
  auto const it =
    std::lower_bound(this->begin(), this->end(), name,
                     [](value_type const& elem, cm::string_view const& k) {
                       return elem.first < k;
                     });
  return (it != this->end() && it->first == name) ? it : this->end();
}